

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O2

void __thiscall irr::gui::CGUISkin::~CGUISkin(CGUISkin *this,void **vtt)

{
  _func_int **pp_Var1;
  IGUIFont *pIVar2;
  IGUISpriteBank *pIVar3;
  u32 i;
  long lVar4;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IGUISkin)._vptr_IGUISkin = pp_Var1;
  *(void **)((long)this->Sizes + (long)(pp_Var1[-3] + -0x6c)) = vtt[3];
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    pIVar2 = this->Fonts[lVar4];
    if (pIVar2 != (IGUIFont *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar2->_vptr_IGUIFont + (long)pIVar2->_vptr_IGUIFont[-3]));
    }
  }
  pIVar3 = this->SpriteBank;
  if (pIVar3 != (IGUISpriteBank *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar3->_vptr_IGUISpriteBank + (long)pIVar3->_vptr_IGUISpriteBank[-3]));
  }
  lVar4 = 0x238;
  do {
    ::std::__cxx11::wstring::_M_dispose();
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != 0x138);
  return;
}

Assistant:

CGUISkin::~CGUISkin()
{
	for (u32 i = 0; i < EGDF_COUNT; ++i) {
		if (Fonts[i])
			Fonts[i]->drop();
	}

	if (SpriteBank)
		SpriteBank->drop();
}